

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Apply * __thiscall jsonnet::internal::Desugarer::stdFunc(Desugarer *this,UString *name,AST *v)

{
  initializer_list<jsonnet::internal::ArgParam> __l;
  void **args_7;
  long in_RDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  UString *in_stack_fffffffffffffe88;
  Desugarer *in_stack_fffffffffffffe90;
  undefined1 *puVar1;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *args_4;
  AST *expr;
  undefined1 *this_00;
  allocator_type *in_stack_fffffffffffffea8;
  LocationRange *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  LocationRange *in_stack_fffffffffffffec0;
  Desugarer *in_stack_fffffffffffffec8;
  Desugarer *in_stack_fffffffffffffed0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffed8;
  undefined8 **ppuVar2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffee0;
  undefined8 **ppuVar3;
  bool *in_stack_fffffffffffffee8;
  LiteralString **in_stack_fffffffffffffef0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff19;
  undefined1 in_stack_ffffffffffffff1a;
  undefined5 in_stack_ffffffffffffff1b;
  undefined1 *local_d0 [11];
  undefined8 *local_78;
  undefined8 local_70;
  undefined1 local_50 [80];
  
  args_7 = (void **)(in_RDX + 8);
  local_50._32_8_ = std(in_stack_fffffffffffffed0);
  local_50[0x1f] = '\0';
  local_50._16_8_ = str(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_50._8_8_ = 0;
  local_50._0_8_ = (_func_int **)0x0;
  this_00 = EF;
  expr = (AST *)local_50;
  puVar1 = EF;
  local_50._40_8_ =
       make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                 (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                  &in_stack_fffffffffffffeb8->idFodder,(Var **)in_stack_fffffffffffffeb0,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_fffffffffffffea8,(bool *)EF,in_stack_fffffffffffffef0,
                  in_stack_fffffffffffffef8,args_7,in_RDI,(void **)EF,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)CONCAT53(in_stack_ffffffffffffff1b,
                              CONCAT12(in_stack_ffffffffffffff1a,
                                       CONCAT11(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18)
                                      )));
  ArgParam::ArgParam((ArgParam *)this_00,expr,(Fodder *)puVar1);
  local_78 = local_d0;
  local_70 = 1;
  ::std::allocator<jsonnet::internal::ArgParam>::allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x2ab2f5);
  __l._M_len = (size_type)in_stack_fffffffffffffec0;
  __l._M_array = in_stack_fffffffffffffeb8;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffffeb0,__l,in_stack_fffffffffffffea8);
  args_4 = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
           &stack0xffffffffffffff19;
  puVar1 = EF;
  local_50._72_8_ =
       make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                 ((Desugarer *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_fffffffffffffea8,(Index **)this_00,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)expr,args_4,(bool *)in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (args_4);
  ::std::allocator<jsonnet::internal::ArgParam>::~allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x2ab3ab);
  ppuVar3 = (undefined8 **)local_d0;
  ppuVar2 = &local_78;
  do {
    ppuVar2 = ppuVar2 + -0xb;
    ArgParam::~ArgParam((ArgParam *)puVar1);
  } while (ppuVar2 != ppuVar3);
  return (Apply *)local_50._72_8_;
}

Assistant:

Apply *stdFunc(const UString &name, AST *v)
    {
        return make<Apply>(
            v->location,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{v, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }